

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

_Bool object_has_standard_to_h(object *obj)

{
  _Bool _Var1;
  object *obj_local;
  
  if (obj->kind == (object_kind *)0x0) {
    obj_local._7_1_ = true;
  }
  else {
    _Var1 = tval_is_body_armor(obj);
    if ((!_Var1) || (_Var1 = randcalc_varies((random_value)obj->kind->to_h), _Var1)) {
      obj_local._7_1_ = obj->to_h == 0;
    }
    else {
      obj_local._7_1_ = (int)obj->to_h == (obj->kind->to_h).base;
    }
  }
  return obj_local._7_1_;
}

Assistant:

bool object_has_standard_to_h(const struct object *obj)
{
	/* Hack for curse object structures */
	if (!obj->kind) {
		return true;
	}
	if (tval_is_body_armor(obj) && !randcalc_varies(obj->kind->to_h)) {
		return (obj->to_h == obj->kind->to_h.base);
	} else {
		return (obj->to_h == 0);
	}
}